

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

SearchStatus __thiscall tsbp::TwoStepBranchingProcedure::Solve(TwoStepBranchingProcedure *this)

{
  SearchStatus SVar1;
  size_type sVar2;
  iterator iVar3;
  iterator iVar4;
  double dVar5;
  TwoStepBranchingProcedure *in_stack_00000530;
  duration<long,_std::ratio<1L,_1000000000L>_> local_98;
  duration<long,_std::ratio<1L,_1000L>_> local_90;
  rep local_88;
  rep time;
  time_point end;
  allocator<int> local_39;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> itemOrder;
  int numberOfThreads;
  SearchStatus searchStatus;
  time_point start;
  TwoStepBranchingProcedure *this_local;
  
  start.__d.__r = (duration)(duration)this;
  _numberOfThreads = (duration)std::chrono::_V2::steady_clock::now();
  itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = (this->parameters).TSBPThreads;
  sVar2 = CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(&this->items);
  std::allocator<int>::allocator(&local_39);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,sVar2,&local_39);
  std::allocator<int>::~allocator(&local_39);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_38);
  iVar4 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_38)
  ;
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,0);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_38);
  iVar4 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_38)
  ;
  CompareLexicographicDxDy::CompareLexicographicDxDy((CompareLexicographicDxDy *)&end,&this->items);
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,tsbp::CompareLexicographicDxDy>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
             (CompareLexicographicDxDy)end.__d.__r);
  std::vector<int,_std::allocator<int>_>::operator=
            (&this->branchingOrder,(vector<int,_std::allocator<int>_> *)local_38);
  if ((int)itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage == 1) {
    itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = SolveSequential(this);
    sVar2 = std::
            vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ::size(&(this->tree).super_type.m_vertices);
    (this->statistics).NodeCountTSBP = sVar2;
  }
  else if ((int)itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < 1) {
    std::operator<<((ostream *)&std::cout,
                    "Invalid number of threads parameter, solve in sequential mode.\n");
    itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = SolveSequential(this);
  }
  else {
    itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = SolveParallelTaskflow(in_stack_00000530);
  }
  time = std::chrono::_V2::steady_clock::now();
  local_98.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&time,(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                           *)&numberOfThreads);
  local_90.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_98);
  local_88 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_90);
  (this->statistics).TimeOverall = (double)local_88;
  (this->statistics).TimeTSBP = (double)local_88 - (this->statistics).TimeLMAO;
  dVar5 = MemoryUsedByCurrentProcess();
  SVar1 = itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  (this->statistics).MemoryUsage = dVar5;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return SVar1;
}

Assistant:

SearchStatus TwoStepBranchingProcedure::Solve()
{
    auto start = std::chrono::steady_clock::now();

    SearchStatus searchStatus = SearchStatus::None;
    int numberOfThreads = this->parameters.TSBPThreads;

    std::vector<int> itemOrder(items.size());
    std::iota(itemOrder.begin(), itemOrder.end(), 0);
    std::sort(itemOrder.begin(), itemOrder.end(), CompareLexicographicDxDy(&items));

    this->branchingOrder = itemOrder;

    if (numberOfThreads == 1)
    {
        searchStatus = SolveSequential();
        this->statistics.NodeCountTSBP = this->tree.m_vertices.size();
    }
    else if (numberOfThreads >= 1)
    {
        searchStatus = SolveParallelTaskflow();
        ////searchStatus = SolveParallelNative();
    }
    else
    {
        std::cout << "Invalid number of threads parameter, solve in sequential mode.\n";
        searchStatus = SolveSequential();
    }

    auto end = std::chrono::steady_clock::now();
    auto time = std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count();

    this->statistics.TimeOverall = time;
    this->statistics.TimeTSBP = time - this->statistics.TimeLMAO;
    this->statistics.MemoryUsage = MemoryUsedByCurrentProcess();

    return searchStatus;
}